

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O2

Matrix_Dense<double,_0UL,_0UL> *
Disa::operator*(Matrix_Dense<double,_0UL,_0UL> *__return_storage_ptr__,Scalar *scalar,
               Matrix_Dense<double,_0UL,_0UL> *matrix)

{
  vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_> *__x;
  
  __x = &Matrix_Dense<double,_0UL,_0UL>::operator*=(matrix,scalar)->
         super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
  ;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  vector(&__return_storage_ptr__->
          super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
         ,__x);
  return __return_storage_ptr__;
}

Assistant:

constexpr Matrix_Dense<_type, _row, _col> operator*(const Scalar& scalar, Matrix_Dense<_type, _row, _col> matrix) {
  return matrix *= scalar;
}